

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

bool __thiscall
pstore::romfs::directory::check
          (directory *this,not_null<const_pstore::romfs::directory_*> parent,
          check_stack_entry *visited)

{
  check_stack_entry **ppcVar1;
  pointer pvVar2;
  size_t sVar3;
  directory *this_00;
  bool bVar4;
  bool bVar5;
  int iVar6;
  iterator d;
  iterator d_00;
  not_null<const_pstore::romfs::directory_*> *pnVar7;
  pointer pvVar8;
  check_stack_entry *pcVar9;
  long lVar10;
  pointer pvVar11;
  dirent *__name;
  error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> od;
  check_stack_entry me;
  not_null<const_pstore::romfs::directory_*> local_70;
  anon_union_16_2_eb5a95ea_for_error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>_1
  local_68;
  bool local_58;
  check_stack_entry *local_50;
  check_stack_entry local_48;
  not_null<const_directory_*> local_38;
  
  sVar3 = this->size_;
  pvVar11 = (this->members_).ptr_;
  pcVar9 = visited;
  if (visited != (check_stack_entry *)0x0) {
    do {
      if ((pcVar9->d).ptr_ == parent.ptr_) {
        return true;
      }
      ppcVar1 = &pcVar9->prev;
      pcVar9 = *ppcVar1;
    } while (*ppcVar1 != (check_stack_entry *)0x0);
  }
  pvVar2 = pvVar11 + sVar3;
  if (sVar3 != 0) {
    lVar10 = sVar3 * 0x28;
    pvVar8 = pvVar11;
    do {
      lVar10 = lVar10 + -0x28;
      if (lVar10 == 0) goto LAB_00120699;
      pvVar11 = pvVar8 + 1;
      iVar6 = strcmp(pvVar8[1].name_.ptr_,(pvVar8->name_).ptr_);
      pvVar8 = pvVar11;
    } while (-1 < iVar6);
  }
  if (pvVar11 == pvVar2) {
LAB_00120699:
    local_68.storage_ = (type)((long)".." + 1);
    local_50 = visited;
    pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_68);
    d = find(this,(not_null<const_char_*>)local_68.storage_,1);
    local_68.storage_ = (type)0x12461c;
    pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_68);
    d_00 = find(this,(not_null<const_char_*>)local_68.storage_,2);
    if (d_00.pos_ != pvVar2 && d.pos_ != pvVar2) {
      local_38.ptr_ = this;
      pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&local_38);
      bVar4 = anon_unknown.dwarf_1063a1::is_expected_dir(d.pos_,local_38);
      if ((bVar4) &&
         (bVar4 = anon_unknown.dwarf_1063a1::is_expected_dir
                            (d_00.pos_,(not_null<const_directory_*>)parent.ptr_), bVar4)) {
        if (this->size_ == 0) {
          return true;
        }
        __name = (this->members_).ptr_;
        lVar10 = this->size_ * 0x28;
        bVar4 = true;
        do {
          if ((__name->stat_).mode == directory) {
            dirent::opendir((dirent *)&local_68,(char *)__name);
            if (local_58 == false) {
              pnVar7 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                       value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                                 ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>
                                   *)&local_68);
              local_48.d.ptr_ = pnVar7->ptr_;
              local_48.prev = local_50;
              pnVar7 = error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
                       value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>const&,pstore::gsl::not_null<pstore::romfs::directory_const*>const>
                                 ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_>
                                   *)&local_68);
              this_00 = pnVar7->ptr_;
              local_70.ptr_ = this;
              pstore::gsl::not_null<const_pstore::romfs::directory_*>::ensure_invariant(&local_70);
              bVar5 = check(this_00,local_70,&local_48);
              bVar4 = (bool)(bVar4 & bVar5);
            }
            else {
              bVar5 = false;
              bVar4 = false;
            }
            if ((local_58 & 1U) == 0) {
              error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
              value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,pstore::gsl::not_null<pstore::romfs::directory_const*>>
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                         &local_68);
            }
            else {
              error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
              error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>&,std::error_code>
                        ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)
                         &local_68);
            }
            if (bVar5 == false) {
              return bVar4;
            }
          }
          __name = __name + 1;
          lVar10 = lVar10 + -0x28;
          if (lVar10 == 0) {
            return true;
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool directory::check (gsl::not_null<directory const *> const parent,
                               check_stack_entry const * const visited) const {
            auto const end = this->end ();

            // This stops us from looping forever if we follow a directory pointer to a directory
            // that we have already visited.
            for (auto const * v = visited; v != nullptr; v = v->prev) {
                if (v->d == parent) {
                    return true;
                }
            }

            // Check that the directory entries are sorted by name.
            if (!std::is_sorted (begin (), end, [] (dirent const & a, dirent const & b) {
                    return std::strcmp (a.name (), b.name ()) < 0;
                })) {
                return false;
            }

            // Look for the '.' and '..' entries and check that they point where we expect.
            iterator const dot = this->find (".");
            iterator const dot_dot = this->find ("..");
            if (dot == end || dot_dot == end) {
                return false;
            }
            if (!is_expected_dir (*dot, this) || !is_expected_dir (*dot_dot, parent)) {
                return false;
            }

            // Recursively check any directories contained by this one.
            for (dirent const & de : *this) {
                if (de.is_directory ()) {
                    if (auto const od = de.opendir ()) {
                        check_stack_entry const me{*od, visited};
                        if (!(*od)->check (this, &me)) {
                            // Error: recursive check failed.
                            return false;
                        }
                    } else {
                        // Error: this entry claimed to be a directory but opendir() failed.
                        return false;
                    }
                }
            }

            return true;
        }